

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void libtorrent::aux::anon_unknown_119::put_mutable_callback
               (item *i,function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *cb)

{
  sequence_number seq;
  string salt;
  entry value;
  public_key pk;
  signature sig;
  sequence_number local_f8;
  span<const_char> local_f0;
  entry local_d0;
  public_key local_a8;
  array<char,_64UL> local_88;
  entry local_40;
  
  entry::entry(&local_d0,&i->m_value);
  local_88._M_elems._0_8_ = *(undefined8 *)(i->m_sig).bytes._M_elems;
  local_88._M_elems._8_8_ = *(undefined8 *)((i->m_sig).bytes._M_elems + 8);
  local_88._M_elems._16_8_ = *(undefined8 *)((i->m_sig).bytes._M_elems + 0x10);
  local_88._M_elems._24_8_ = *(undefined8 *)((i->m_sig).bytes._M_elems + 0x18);
  local_88._M_elems._32_8_ = *(undefined8 *)((i->m_sig).bytes._M_elems + 0x20);
  local_88._M_elems._40_8_ = *(undefined8 *)((i->m_sig).bytes._M_elems + 0x28);
  local_88._M_elems._48_8_ = *(undefined8 *)((i->m_sig).bytes._M_elems + 0x30);
  local_88._M_elems._56_8_ = *(undefined8 *)((i->m_sig).bytes._M_elems + 0x38);
  local_a8.bytes._M_elems._0_8_ = *(undefined8 *)(i->m_pk).bytes._M_elems;
  local_a8.bytes._M_elems._8_8_ = *(undefined8 *)((i->m_pk).bytes._M_elems + 8);
  local_a8.bytes._M_elems._16_8_ = *(undefined8 *)((i->m_pk).bytes._M_elems + 0x10);
  local_a8.bytes._M_elems._24_8_ = *(undefined8 *)((i->m_pk).bytes._M_elems + 0x18);
  local_f8.value = (i->m_seq).value;
  ::std::__cxx11::string::string((string *)&local_f0,(string *)&i->m_salt);
  ::std::
  function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator()(cb,&local_d0,&local_88,&local_f8.value,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0);
  entry::entry(&local_40,&local_d0);
  dht::item::assign(i,&local_40,local_f0,local_f8,&local_a8,(signature *)&local_88);
  entry::~entry(&local_40);
  ::std::__cxx11::string::~string((string *)&local_f0);
  entry::~entry(&local_d0);
  return;
}

Assistant:

void put_mutable_callback(dht::item& i
			, std::function<void(entry&, std::array<char, 64>&
				, std::int64_t&, std::string const&)> cb)
		{
			entry value = i.value();
			dht::signature sig = i.sig();
			dht::public_key pk = i.pk();
			dht::sequence_number seq = i.seq();
			std::string salt = i.salt();
			cb(value, sig.bytes, seq.value, salt);
			i.assign(std::move(value), salt, seq, pk, sig);
		}